

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O2

bool __thiscall llvm::convertUTF16ToUTF8String(llvm *this,ArrayRef<char> SrcBytes,string *Out)

{
  ushort *puVar1;
  uint __line;
  unsigned_short uVar2;
  ConversionResult CVar3;
  long *plVar4;
  char *__assertion;
  ulong uVar5;
  llvm *__last;
  bool bVar6;
  UTF16 *Src;
  UTF8 *Dst;
  vector<unsigned_short,_std::allocator<unsigned_short>_> ByteSwapped;
  
  plVar4 = (long *)SrcBytes.Length;
  if (plVar4[1] != 0) {
    __assertion = "Out.empty()";
    __line = 0x58;
LAB_0015f674:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTFWrapper.cpp"
                  ,__line,"bool llvm::convertUTF16ToUTF8String(ArrayRef<char>, std::string &)");
  }
  if (((undefined1  [16])SrcBytes & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (SrcBytes.Data == (char *)0x0) {
      bVar6 = true;
    }
    else {
      __last = this + (long)SrcBytes.Data;
      ByteSwapped.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ByteSwapped.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ByteSwapped.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar2 = *(unsigned_short *)this;
      Src = (UTF16 *)this;
      if (uVar2 == 0xfffe) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        insert<unsigned_short_const*,void>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&ByteSwapped,
                   (const_iterator)0x0,(unsigned_short *)this,(unsigned_short *)__last);
        for (uVar5 = 0;
            ((ulong)((long)ByteSwapped.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)ByteSwapped.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 1 & 0xffffffff) != uVar5;
            uVar5 = uVar5 + 1) {
          puVar1 = ByteSwapped.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar5;
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        }
        Src = ByteSwapped.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
        __last = (llvm *)(((long)ByteSwapped.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)ByteSwapped.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start) +
                         (long)ByteSwapped.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        uVar2 = *ByteSwapped.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      if (uVar2 == 0xfeff) {
        Src = Src + 1;
      }
      std::__cxx11::string::resize((ulong)plVar4);
      Dst = (UTF8 *)*plVar4;
      CVar3 = ConvertUTF16toUTF8(&Src,(UTF16 *)__last,&Dst,Dst + plVar4[1],strictConversion);
      if (CVar3 == targetExhausted) {
        __assertion = "CR != targetExhausted";
        __line = 0x7b;
        goto LAB_0015f674;
      }
      bVar6 = CVar3 == conversionOK;
      if (bVar6) {
        std::__cxx11::string::resize((ulong)plVar4);
        std::__cxx11::string::push_back((char)SrcBytes.Length);
        std::__cxx11::string::pop_back();
      }
      else {
        plVar4[1] = 0;
        *(undefined1 *)*plVar4 = 0;
      }
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&ByteSwapped.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool convertUTF16ToUTF8String(ArrayRef<char> SrcBytes, std::string &Out) {
  assert(Out.empty());

  // Error out on an uneven byte count.
  if (SrcBytes.size() % 2)
    return false;

  // Avoid OOB by returning early on empty input.
  if (SrcBytes.empty())
    return true;

  const UTF16 *Src = reinterpret_cast<const UTF16 *>(SrcBytes.begin());
  const UTF16 *SrcEnd = reinterpret_cast<const UTF16 *>(SrcBytes.end());

  // Byteswap if necessary.
  std::vector<UTF16> ByteSwapped;
  if (Src[0] == UNI_UTF16_BYTE_ORDER_MARK_SWAPPED) {
    ByteSwapped.insert(ByteSwapped.end(), Src, SrcEnd);
    for (unsigned I = 0, E = ByteSwapped.size(); I != E; ++I)
      ByteSwapped[I] = llvm::sys::SwapByteOrder_16(ByteSwapped[I]);
    Src = &ByteSwapped[0];
    SrcEnd = &ByteSwapped[ByteSwapped.size() - 1] + 1;
  }

  // Skip the BOM for conversion.
  if (Src[0] == UNI_UTF16_BYTE_ORDER_MARK_NATIVE)
    Src++;

  // Just allocate enough space up front.  We'll shrink it later.  Allocate
  // enough that we can fit a null terminator without reallocating.
  Out.resize(SrcBytes.size() * UNI_MAX_UTF8_BYTES_PER_CODE_POINT + 1);
  UTF8 *Dst = reinterpret_cast<UTF8 *>(&Out[0]);
  UTF8 *DstEnd = Dst + Out.size();

  ConversionResult CR =
      ConvertUTF16toUTF8(&Src, SrcEnd, &Dst, DstEnd, strictConversion);
  assert(CR != targetExhausted);

  if (CR != conversionOK) {
    Out.clear();
    return false;
  }

  Out.resize(reinterpret_cast<char *>(Dst) - &Out[0]);
  Out.push_back(0);
  Out.pop_back();
  return true;
}